

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChFunctionRotation::Get_a_loc
          (ChVector<double> *__return_storage_ptr__,ChFunctionRotation *this,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChQuaternion<double> q1;
  ChQuaternion<double> q2;
  ChQuaternion<double> q0;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  (*this->_vptr_ChFunctionRotation[3])(s + -1e-07,&local_48);
  (*this->_vptr_ChFunctionRotation[3])(s,&local_88,this);
  (*this->_vptr_ChFunctionRotation[3])(s + 1e-07,&local_68,this);
  auVar14._0_8_ = local_88 + local_88;
  auVar14._8_8_ = dStack_80 + dStack_80;
  auVar15._0_8_ = local_78 + local_78;
  auVar15._8_8_ = dStack_70 + dStack_70;
  auVar5 = vshufpd_avx(auVar14,auVar14,1);
  auVar6 = vshufpd_avx(auVar15,auVar15,1);
  dVar1 = ((local_48 - auVar14._0_8_) + local_68) * 100000000000000.02;
  dVar2 = ((local_38 - auVar15._0_8_) + local_58) * 100000000000000.02;
  dVar3 = ((local_40 - auVar5._0_8_) + local_60) * 100000000000000.02;
  dVar4 = ((local_30 - auVar6._0_8_) + local_50) * 100000000000000.02;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar14._0_8_ * dVar3;
  auVar9 = vfnmadd231sd_fma(auVar18,auVar5,auVar7);
  auVar8._8_8_ = dVar1;
  auVar8._0_8_ = dVar1;
  auVar17._0_8_ = -auVar5._0_8_;
  auVar17._8_8_ = auVar5._8_8_ ^ 0x8000000000000000;
  auVar16._0_8_ = -auVar15._0_8_;
  auVar16._8_8_ = -auVar15._8_8_;
  auVar7 = vshufpd_avx(auVar16,auVar15,1);
  auVar10._0_8_ = auVar7._0_8_ * dVar3;
  auVar10._8_8_ = auVar7._8_8_ * dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2;
  auVar7 = vfmadd231sd_fma(auVar9,auVar11,auVar6);
  auVar12._8_8_ = dVar2;
  auVar12._0_8_ = dVar2;
  auVar9 = vfnmadd213pd_fma(auVar8,auVar15,auVar10);
  auVar6 = vunpcklpd_avx(auVar14,auVar17);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4;
  auVar7 = vfnmadd231sd_fma(auVar7,auVar15,auVar13);
  auVar6 = vfmadd213pd_fma(auVar12,auVar6,auVar9);
  auVar9._8_8_ = dVar4;
  auVar9._0_8_ = dVar4;
  __return_storage_ptr__->m_data[0] = auVar7._0_8_;
  auVar5 = vfmadd213pd_fma(auVar9,auVar5,auVar6);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data + 1) = auVar5;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionRotation::Get_a_loc(double s) const {
		ChQuaternion<> q0 = Get_q(s - BDF_STEP_LOW);
		ChQuaternion<> q1 = Get_q(s);
		ChQuaternion<> q2 = Get_q(s + BDF_STEP_LOW);
		ChQuaternion<> qdtdt = (q0 - q1*2.0 + q2) / (BDF_STEP_LOW*BDF_STEP_LOW);
		ChGlMatrix34<> Gl(q1);
        return Gl * qdtdt;
}